

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O1

shared_ptr<LNode> __thiscall LParser::reduce_42(LParser *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<LNode> sVar2;
  vector<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_> local_58;
  vector<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_> local_38;
  
  local_58.super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar1 = (element_type *)operator_new(0x38);
  (peVar1->token)._M_dataplus._M_p = (pointer)0x100000001;
  *(undefined ***)peVar1 = &PTR___Sp_counted_ptr_inplace_00122790;
  *(undefined4 *)&(peVar1->token).field_2 = 0x32;
  (peVar1->token)._M_string_length = (size_type)&PTR__LNodeData_001227e0;
  *(undefined8 *)((long)&(peVar1->token).field_2 + 8) = 0;
  *(undefined8 *)(peVar1 + 1) = 0;
  peVar1[1].token._M_dataplus._M_p = (pointer)0x0;
  local_38.super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = *(pointer *)(peVar1 + 1);
  local_38.super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)peVar1[1].token._M_dataplus._M_p;
  *(pointer *)((long)&(peVar1->token).field_2 + 8) =
       local_58.super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(peVar1 + 1) =
       local_58.super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  peVar1[1].token._M_dataplus._M_p =
       (pointer)local_58.
                super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>::~vector(&local_38);
  (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
  super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl = (LLexer *)&(peVar1->token)._M_string_length;
  (this->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  std::vector<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>::~vector(&local_58);
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_42() {
    // NIEStmts : 
    return std::make_shared<LNodeData<LNodeChildren>>(LNodeType::NIEStmt, LNodeChildren());
}